

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O1

int sendsimplehttpgetreq(SOCKET sock,char *url)

{
  char *__s;
  size_t sVar1;
  char *__s_00;
  char *pcVar2;
  char *pcVar3;
  ssize_t sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  sVar1 = strlen(url);
  __s_00 = (char *)calloc(sVar1 + 0x100,1);
  iVar6 = 6;
  if (__s_00 != (char *)0x0) {
    __s = url + 7;
    pcVar2 = strchr(__s,0x2f);
    pcVar3 = url + sVar1;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    iVar8 = (int)pcVar3 - (int)url;
    uVar5 = iVar8 - 7;
    if ((int)uVar5 < 1) {
      free(__s_00);
      iVar6 = 3;
    }
    else {
      pcVar3 = (char *)calloc((ulong)(iVar8 - 6),1);
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar3,__s,(ulong)uVar5);
        sVar1 = strlen(pcVar3);
        iVar6 = 0;
        sprintf(__s_00,"GET %s HTTP/1.1\r\nHost: %s\r\n\r\n",__s + sVar1);
        free(pcVar3);
        sVar1 = strlen(__s_00);
        iVar8 = (int)sVar1;
        if (0 < iVar8) {
          uVar7 = 0;
          do {
            sVar4 = send(sock,__s_00 + uVar7,(long)(iVar8 - (int)uVar7),0);
            iVar6 = (int)sVar4;
            if (iVar6 < 0) {
              iVar6 = 1;
              goto LAB_00166d5c;
            }
            if (iVar6 == 0) {
              iVar6 = 2;
              goto LAB_00166d5c;
            }
            uVar5 = (int)uVar7 + iVar6;
            uVar7 = (ulong)uVar5;
          } while ((int)uVar5 < iVar8);
          iVar6 = 0;
        }
      }
LAB_00166d5c:
      free(__s_00);
    }
  }
  return iVar6;
}

Assistant:

inline int sendsimplehttpgetreq(SOCKET sock, char* url)
{
	int ret = EXIT_FAILURE;
	char* sendbuf = NULL;
	int sendbuflen = 0;
	char* address = NULL;
	int count = 0;
	char* ptr = NULL;

	sendbuf = (char*)calloc(strlen(url)+256, 1);
	if (sendbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		return EXIT_OUT_OF_MEMORY;
	}

	ptr = strchr(url+strlen("http://"), '/');
	if (ptr == NULL) ptr = url+strlen(url);
	count = (int)(ptr-url-strlen("http://"));
	if (count <= 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_PARAMETER],
			(int)sock, url));
		free(sendbuf);
		return EXIT_INVALID_PARAMETER;
	}

	address = (char*)calloc(count+1, 1);
	if (address == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		free(sendbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(address, url+strlen("http://"), count);
	sprintf(sendbuf,
		"GET %s HTTP/1.1\r\n"
		"Host: %s\r\n"
//		"Accept: text/html\r\n"
		"\r\n",
		url+strlen("http://")+strlen(address), address);
	free(address);
	sendbuflen = (int)strlen(sendbuf);
	ret = sendall(sock, sendbuf, sendbuflen);
	if (ret != EXIT_SUCCESS)
	{
		free(sendbuf);
		return ret;
	}

	free(sendbuf);

	return EXIT_SUCCESS;
}